

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

ptrdiff_t mp_check_int(char *cur,char *end)

{
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x6de,"ptrdiff_t mp_check_int(const char *, const char *)");
  }
  if (mp_type_hint[(byte)*cur] == MP_INT) {
    return (ptrdiff_t)(cur + ((long)""[(byte)*cur] - (long)end) + 1);
  }
  __assert_fail("mp_typeof(*cur) == MP_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x6df,"ptrdiff_t mp_check_int(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_int(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_INT);
	uint8_t c = mp_load_u8(&cur);
	return mp_parser_hint[c] - (end - cur);
}